

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O1

void __thiscall SQNativeClosure::Release(SQNativeClosure *this)

{
  SQUnsignedInteger SVar1;
  long lVar2;
  long lVar3;
  
  SVar1 = this->_noutervalues;
  if (0 < (long)SVar1) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      SQObjectPtr::~SQObjectPtr
                ((SQObjectPtr *)((long)&(this->_outervalues->super_SQObject)._type + lVar3));
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar2 < (long)this->_noutervalues);
  }
  (**(this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted)(this);
  sq_free(this,SVar1 * 0x10 + 0x80);
  return;
}

Assistant:

void Release(){
        SQInteger size = _CALC_NATVIVECLOSURE_SIZE(_noutervalues);
        _DESTRUCT_VECTOR(SQObjectPtr,_noutervalues,_outervalues);
        this->~SQNativeClosure();
        sq_free(this,size);
    }